

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O0

void google::protobuf::Field::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Field *pFVar2;
  MessageLite *value;
  string *psVar3;
  bool bVar4;
  Field_Kind FVar5;
  Field_Cardinality FVar6;
  int32_t iVar7;
  Field **v1;
  Field **v2;
  char *failure_msg;
  LogMessage *pLVar8;
  RepeatedPtrField<google::protobuf::Option> *this;
  RepeatedPtrField<google::protobuf::Option> *other;
  uint32_t *puVar9;
  ulong uVar10;
  Arena *pAVar11;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  MessageLite local_140 [2];
  uint local_120;
  uint32_t cached_has_bits;
  LogMessage local_110;
  Voidify local_f9;
  Field *local_f8;
  Nullable<const_char_*> local_f0;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Field *from;
  Field *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Field *local_c0;
  anon_union_88_1_493b367e_for_Field_34 *local_b8;
  string *local_b0;
  Field *local_a8;
  anon_union_88_1_493b367e_for_Field_34 *local_a0;
  string *local_98;
  Field *local_90;
  anon_union_88_1_493b367e_for_Field_34 *local_88;
  string *local_80;
  Field *local_78;
  anon_union_88_1_493b367e_for_Field_34 *local_70;
  string *local_68;
  Field *local_60;
  anon_union_88_1_493b367e_for_Field_34 *local_58;
  string *local_50;
  Field *local_48;
  anon_union_88_1_493b367e_for_Field_34 *local_40;
  string *local_38;
  Field *local_30;
  anon_union_88_1_493b367e_for_Field_34 *local_28;
  string *local_20;
  Field *local_18;
  anon_union_88_1_493b367e_for_Field_34 *local_10;
  
  local_f8 = (Field *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (Field *)to_msg;
  _this = (Field *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Field_const*>
                 (&local_f8);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Field*>(&from);
  local_f0 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::Field_const*,google::protobuf::Field*>
                       (v1,v2,"&from != _this");
  if (local_f0 == (Nullable<const_char_*>)0x0) {
    local_120 = 0;
    this = _internal_mutable_options(from);
    other = _internal_options((Field *)absl_log_internal_check_op_result);
    RepeatedPtrField<google::protobuf::Option>::MergeFrom(this,other);
    puVar9 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    local_120 = *puVar9;
    if ((local_120 & 0xff) != 0) {
      if ((local_120 & 1) != 0) {
        _internal_name_abi_cxx11_((Field *)absl_log_internal_check_op_result);
        uVar10 = std::__cxx11::string::empty();
        pFVar2 = from;
        if ((uVar10 & 1) == 0) {
          local_b0 = _internal_name_abi_cxx11_((Field *)absl_log_internal_check_op_result);
          local_a8 = pFVar2;
          local_a0 = &pFVar2->field_0;
          puVar9 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
          psVar3 = local_b0;
          *puVar9 = *puVar9 | 1;
          pAVar11 = protobuf::MessageLite::GetArena((MessageLite *)pFVar2);
          internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.name_,psVar3,pAVar11);
        }
        else {
          bVar4 = internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.name_);
          pFVar2 = from;
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_140,anon_var_dwarf_37cdd0 + 5,&local_141);
            local_c0 = pFVar2;
            to_msg_local = local_140;
            local_b8 = &pFVar2->field_0;
            puVar9 = internal::HasBits<1>::operator[](&(local_b8->_impl_)._has_bits_,0);
            value = to_msg_local;
            *(byte *)puVar9 = (byte)*puVar9 | 1;
            pAVar11 = protobuf::MessageLite::GetArena((MessageLite *)pFVar2);
            internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.name_,(string *)value,pAVar11)
            ;
            std::__cxx11::string::~string((string *)local_140);
            std::allocator<char>::~allocator(&local_141);
          }
        }
      }
      if ((local_120 & 2) != 0) {
        _internal_type_url_abi_cxx11_((Field *)absl_log_internal_check_op_result);
        uVar10 = std::__cxx11::string::empty();
        pFVar2 = from;
        if ((uVar10 & 1) == 0) {
          local_80 = _internal_type_url_abi_cxx11_((Field *)absl_log_internal_check_op_result);
          local_78 = pFVar2;
          local_70 = &pFVar2->field_0;
          puVar9 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
          psVar3 = local_80;
          *puVar9 = *puVar9 | 2;
          pAVar11 = protobuf::MessageLite::GetArena((MessageLite *)pFVar2);
          internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.type_url_,psVar3,pAVar11);
        }
        else {
          bVar4 = internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.type_url_);
          pFVar2 = from;
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_168,anon_var_dwarf_37cdd0 + 5,&local_169);
            local_90 = pFVar2;
            local_98 = &local_168;
            local_88 = &pFVar2->field_0;
            puVar9 = internal::HasBits<1>::operator[](&(local_88->_impl_)._has_bits_,0);
            psVar3 = local_98;
            *(byte *)puVar9 = (byte)*puVar9 | 2;
            pAVar11 = protobuf::MessageLite::GetArena((MessageLite *)pFVar2);
            internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.type_url_,psVar3,pAVar11);
            std::__cxx11::string::~string((string *)&local_168);
            std::allocator<char>::~allocator(&local_169);
          }
        }
      }
      if ((local_120 & 4) != 0) {
        _internal_json_name_abi_cxx11_((Field *)absl_log_internal_check_op_result);
        uVar10 = std::__cxx11::string::empty();
        pFVar2 = from;
        if ((uVar10 & 1) == 0) {
          local_50 = _internal_json_name_abi_cxx11_((Field *)absl_log_internal_check_op_result);
          local_48 = pFVar2;
          local_40 = &pFVar2->field_0;
          puVar9 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
          psVar3 = local_50;
          *puVar9 = *puVar9 | 4;
          pAVar11 = protobuf::MessageLite::GetArena((MessageLite *)pFVar2);
          internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.json_name_,psVar3,pAVar11);
        }
        else {
          bVar4 = internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.json_name_);
          pFVar2 = from;
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_190,anon_var_dwarf_37cdd0 + 5,&local_191);
            local_60 = pFVar2;
            local_68 = &local_190;
            local_58 = &pFVar2->field_0;
            puVar9 = internal::HasBits<1>::operator[](&(local_58->_impl_)._has_bits_,0);
            psVar3 = local_68;
            *(byte *)puVar9 = (byte)*puVar9 | 4;
            pAVar11 = protobuf::MessageLite::GetArena((MessageLite *)pFVar2);
            internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.json_name_,psVar3,pAVar11);
            std::__cxx11::string::~string((string *)&local_190);
            std::allocator<char>::~allocator(&local_191);
          }
        }
      }
      if ((local_120 & 8) != 0) {
        _internal_default_value_abi_cxx11_((Field *)absl_log_internal_check_op_result);
        uVar10 = std::__cxx11::string::empty();
        pFVar2 = from;
        if ((uVar10 & 1) == 0) {
          local_20 = _internal_default_value_abi_cxx11_((Field *)absl_log_internal_check_op_result);
          local_18 = pFVar2;
          local_10 = &pFVar2->field_0;
          puVar9 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
          psVar3 = local_20;
          *puVar9 = *puVar9 | 8;
          pAVar11 = protobuf::MessageLite::GetArena((MessageLite *)pFVar2);
          internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.default_value_,psVar3,pAVar11);
        }
        else {
          bVar4 = internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.default_value_);
          pFVar2 = from;
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b8,anon_var_dwarf_37cdd0 + 5,&local_1b9);
            local_30 = pFVar2;
            local_38 = &local_1b8;
            local_28 = &pFVar2->field_0;
            puVar9 = internal::HasBits<1>::operator[](&(local_28->_impl_)._has_bits_,0);
            psVar3 = local_38;
            *(byte *)puVar9 = (byte)*puVar9 | 8;
            pAVar11 = protobuf::MessageLite::GetArena((MessageLite *)pFVar2);
            internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.default_value_,psVar3,pAVar11)
            ;
            std::__cxx11::string::~string((string *)&local_1b8);
            std::allocator<char>::~allocator(&local_1b9);
          }
        }
      }
      if (((local_120 & 0x10) != 0) &&
         (FVar5 = _internal_kind((Field *)absl_log_internal_check_op_result),
         FVar5 != Field_Kind_TYPE_UNKNOWN)) {
        (from->field_0)._impl_.kind_ = *(int *)(absl_log_internal_check_op_result + 0x50);
      }
      if (((local_120 & 0x20) != 0) &&
         (FVar6 = _internal_cardinality((Field *)absl_log_internal_check_op_result),
         FVar6 != Field_Cardinality_CARDINALITY_UNKNOWN)) {
        (from->field_0)._impl_.cardinality_ = *(int *)(absl_log_internal_check_op_result + 0x54);
      }
      if (((local_120 & 0x40) != 0) &&
         (iVar7 = _internal_number((Field *)absl_log_internal_check_op_result), iVar7 != 0)) {
        (from->field_0)._impl_.number_ = *(int32_t *)(absl_log_internal_check_op_result + 0x58);
      }
      if (((local_120 & 0x80) != 0) &&
         (iVar7 = _internal_oneof_index((Field *)absl_log_internal_check_op_result), iVar7 != 0)) {
        (from->field_0)._impl_.oneof_index_ = *(int32_t *)(absl_log_internal_check_op_result + 0x5c)
        ;
      }
    }
    if (((local_120 & 0x100) != 0) &&
       (bVar4 = _internal_packed((Field *)absl_log_internal_check_op_result), bVar4)) {
      (from->field_0)._impl_.packed_ = (bool)(absl_log_internal_check_op_result[0x60] & 1);
    }
    uVar1 = local_120;
    puVar9 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar9 = uVar1 | *puVar9;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_f0);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/type.pb.cc"
             ,0x567,failure_msg);
  pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_110);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_f9,pLVar8);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_110)
  ;
}

Assistant:

void Field::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Field*>(&to_msg);
  auto& from = static_cast<const Field&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Field)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_options()->MergeFrom(
      from._internal_options());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_name().empty()) {
        _this->_internal_set_name(from._internal_name());
      } else {
        if (_this->_impl_.name_.IsDefault()) {
          _this->_internal_set_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_type_url().empty()) {
        _this->_internal_set_type_url(from._internal_type_url());
      } else {
        if (_this->_impl_.type_url_.IsDefault()) {
          _this->_internal_set_type_url("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!from._internal_json_name().empty()) {
        _this->_internal_set_json_name(from._internal_json_name());
      } else {
        if (_this->_impl_.json_name_.IsDefault()) {
          _this->_internal_set_json_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!from._internal_default_value().empty()) {
        _this->_internal_set_default_value(from._internal_default_value());
      } else {
        if (_this->_impl_.default_value_.IsDefault()) {
          _this->_internal_set_default_value("");
        }
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_kind() != 0) {
        _this->_impl_.kind_ = from._impl_.kind_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_cardinality() != 0) {
        _this->_impl_.cardinality_ = from._impl_.cardinality_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_number() != 0) {
        _this->_impl_.number_ = from._impl_.number_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_oneof_index() != 0) {
        _this->_impl_.oneof_index_ = from._impl_.oneof_index_;
      }
    }
  }
  if ((cached_has_bits & 0x00000100u) != 0) {
    if (from._internal_packed() != 0) {
      _this->_impl_.packed_ = from._impl_.packed_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}